

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O1

HighsInt __thiscall HighsGFkSolve::findNonzero(HighsGFkSolve *this,HighsInt row,HighsInt col)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  HighsInt HVar6;
  int iVar7;
  char cVar8;
  int *piVar9;
  int *piVar10;
  HighsInt y;
  long lVar11;
  bool bVar12;
  int local_28;
  int local_24;
  HighsInt Nright;
  HighsInt Nleft;
  
  piVar2 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = piVar2[row];
  if (iVar7 == -1) {
    HVar6 = -1;
  }
  else {
    piVar9 = &local_24;
    local_24 = -1;
    piVar10 = &local_28;
    local_28 = -1;
    piVar3 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (col < piVar3[iVar7]) {
        iVar1 = piVar4[iVar7];
        lVar11 = (long)iVar1;
        if (lVar11 == -1) goto LAB_002a5e25;
        if (col < piVar3[lVar11]) {
          piVar4[iVar7] = piVar5[lVar11];
          piVar5[lVar11] = iVar7;
          bVar12 = piVar4[lVar11] == -1;
          iVar7 = iVar1;
          if (bVar12) goto LAB_002a5e2c;
        }
        *piVar9 = iVar7;
        piVar9 = piVar4 + iVar7;
        iVar7 = *piVar9;
LAB_002a5de8:
        cVar8 = '\0';
      }
      else {
        if (col <= piVar3[iVar7]) break;
        iVar1 = piVar5[iVar7];
        lVar11 = (long)iVar1;
        if (lVar11 != -1) {
          if (piVar3[lVar11] < col) {
            piVar5[iVar7] = piVar4[lVar11];
            piVar4[lVar11] = iVar7;
            bVar12 = piVar5[lVar11] == -1;
            iVar7 = iVar1;
            if (bVar12) {
LAB_002a5e2c:
              cVar8 = bVar12 * '\x03';
              goto LAB_002a5e35;
            }
          }
          *piVar10 = iVar7;
          piVar10 = piVar5 + iVar7;
          iVar7 = *piVar10;
          goto LAB_002a5de8;
        }
LAB_002a5e25:
        cVar8 = '\x03';
      }
LAB_002a5e35:
    } while (cVar8 == '\0');
    piVar3 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar10 = piVar3[iVar7];
    piVar4 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    *piVar9 = piVar4[iVar7];
    piVar3[iVar7] = local_28;
    piVar4[iVar7] = local_24;
    piVar2[row] = iVar7;
    HVar6 = -1;
    if ((this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar7] == col) {
      HVar6 = iVar7;
    }
  }
  return HVar6;
}

Assistant:

HighsInt HighsGFkSolve::findNonzero(HighsInt row, HighsInt col) {
  if (rowroot[row] == -1) return -1;

  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  rowroot[row] =
      highs_splay(col, rowroot[row], get_row_left, get_row_right, get_row_key);

  if (Acol[rowroot[row]] == col) return rowroot[row];

  return -1;
}